

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_scriptpubkey_op_return_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  int iVar1;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((len == 0 || bytes_out == (uchar *)0x0) || (flags != 0 || 0x50 < bytes_len)) {
    iVar1 = -2;
  }
  else {
    iVar1 = wally_script_push_from_bytes(bytes,bytes_len,0,bytes_out + 1,len - 1,written);
    if (iVar1 == 0) {
      *bytes_out = 'j';
      *written = *written + 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_scriptpubkey_op_return_from_bytes(
    const unsigned char *bytes, size_t bytes_len,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    int ret;

    if (written)
        *written = 0;

    if (bytes_len > WALLY_MAX_OP_RETURN_LEN || flags || !bytes_out || !len)
        return WALLY_EINVAL;

    ret = wally_script_push_from_bytes(bytes, bytes_len, flags,
                                       bytes_out + 1, len - 1, written);
    if (ret == WALLY_OK) {
        bytes_out[0] = OP_RETURN;
        *written += 1;
    }
    return ret;
}